

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

kvtree * kvtree_extract(kvtree *hash,char *key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_struct *pkVar2;
  kvtree_elem *pkVar3;
  kvtree_elem *unaff_RBX;
  
  if ((hash != (kvtree *)0x0) && (pkVar3 = kvtree_elem_get(hash,key), pkVar3 != (kvtree_elem *)0x0))
  {
    pkVar1 = (pkVar3->pointers).le_next;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = (pkVar3->pointers).le_prev;
    }
    *(pkVar3->pointers).le_prev = pkVar1;
    if (pkVar3 != (kvtree_elem *)0x0) {
      pkVar2 = pkVar3->hash;
      pkVar3->hash = (kvtree_struct *)0x0;
      kvtree_elem_delete(unaff_RBX);
      return pkVar2;
    }
  }
  return (kvtree *)0x0;
}

Assistant:

kvtree* kvtree_extract(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree* elem_hash = elem->hash;
    elem->hash = NULL;
    kvtree_elem_delete(elem);
    return elem_hash;
  }
  return NULL;
}